

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O2

bool fs_is_safe_char(char c)

{
  int iVar1;
  size_type sVar2;
  undefined7 in_register_00000039;
  bool bVar3;
  
  iVar1 = isalnum((int)CONCAT71(in_register_00000039,c));
  bVar3 = true;
  if (iVar1 == 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&fs_is_safe_char::safe,c,0);
    bVar3 = sVar2 != 0xffffffffffffffff;
  }
  return bVar3;
}

Assistant:

static bool
fs_is_safe_char(const char c)
{
  // unordered_set<char>  8us
  // set<char, std::less<>>  6us
  // vector<char> 0.3us so much faster!
  // <string_view>.find_first_of is same speed as vector<char> but more readable
  static constexpr std::string_view safe = "_-.~@#$%^&()[]{}+=,!";

  return std::isalnum(c) || safe.find_first_of(c) != std::string::npos;
}